

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O0

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (ConditionalExpression *this,MonitorVisitor *visitor)

{
  iterator pCVar1;
  Expression *pEVar2;
  Condition *cond;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *__range3;
  MonitorVisitor *visitor_local;
  ConditionalExpression *this_local;
  
  __end3 = nonstd::span_lite::
           span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::begin
                     (&this->conditions);
  pCVar1 = nonstd::span_lite::
           span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::end
                     (&this->conditions);
  for (; __end3 != pCVar1; __end3 = __end3 + 1) {
    pEVar2 = not_null<const_slang::ast::Expression_*>::operator->(&__end3->expr);
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(pEVar2,visitor);
  }
  pEVar2 = left(this);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(pEVar2,visitor);
  pEVar2 = right(this);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(pEVar2,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions)
            cond.expr->visit(visitor);

        left().visit(visitor);
        right().visit(visitor);
    }